

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.h
# Opt level: O0

uint8_t seek2eol(uint8_t **pos,uint8_t *limit)

{
  uint8_t uVar1;
  uint8_t *limit_local;
  uint8_t **pos_local;
  
  uVar1 = seek2ch(pos,limit,'\n');
  if (uVar1 == '\0') {
    pos_local._7_1_ = '\0';
  }
  else if ((*pos)[-1] == '\r') {
    pos_local._7_1_ = '\x02';
  }
  else {
    pos_local._7_1_ = '\x01';
  }
  return pos_local._7_1_;
}

Assistant:

inline static uint8_t seek2eol(uint8_t **pos, uint8_t *const limit) {
  /* single char lookup using memchr might be better when target is far... */
  if (!seek2ch(pos, limit, '\n'))
    return 0;
  if ((*pos)[-1] == '\r') {
#if HTTP1_PARSER_CONVERT_EOL2NUL
    (*pos)[-1] = (*pos)[0] = 0;
#endif
    return 2;
  }
#if HTTP1_PARSER_CONVERT_EOL2NUL
  (*pos)[0] = 0;
#endif
  return 1;
}